

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

string * __thiscall
pbrt::FilmBase::BaseToString_abi_cxx11_(string *__return_storage_ptr__,FilmBase *this)

{
  Bounds2<int> *in_stack_fffffffffffffff0;
  
  StringPrintf<pbrt::Point2<int>const&,float_const&,pbrt::FilterHandle_const&,std::__cxx11::string_const&,pbrt::Bounds2<int>const&>
            (__return_storage_ptr__,
             (pbrt *)"fullResolution: %s diagonal: %f filter: %s filename: %s pixelBounds: %s",
             (char *)this,(Point2<int> *)&this->diagonal,(float *)&this->filter,
             (FilterHandle *)&this->filename,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->pixelBounds
             ,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string FilmBase::BaseToString() const {
    return StringPrintf("fullResolution: %s diagonal: %f filter: %s filename: %s "
                        "pixelBounds: %s",
                        fullResolution, diagonal, filter, filename, pixelBounds);
}